

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O0

bool iutest::TestSuite::IsSuccessfulTest(TestInfo *p)

{
  bool bVar1;
  undefined1 local_11;
  TestInfo *p_local;
  
  bVar1 = TestInfo::is_ran(p);
  local_11 = false;
  if (bVar1) {
    local_11 = TestInfo::Passed(p);
  }
  return local_11;
}

Assistant:

static bool IsReportableSkipTest(const TestInfo* p) { return p->is_reportable() && IsSkipTest(p); }